

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.cpp
# Opt level: O0

int __thiscall
deci::parser_t::context::expected_tokens(context *this,symbol_kind_type *yyarg,int yyargn)

{
  bool bVar1;
  int yyvalue;
  stack_symbol_type *psVar2;
  symbol_kind_type local_44;
  symbol_kind_type local_40;
  symbol_kind_type local_3c;
  int yyx;
  int yyxend;
  int yychecklim;
  int yyxbegin;
  int yyn;
  int yycount;
  int yyargn_local;
  symbol_kind_type *yyarg_local;
  context *this_local;
  
  yyxbegin = 0;
  psVar2 = stack<deci::parser_t::stack_symbol_type,_std::vector<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>_>
           ::operator[](&this->yyparser_->yystack_,0);
  yyvalue = (int)*(short *)(yypact_ +
                           (long)(int)(psVar2->super_basic_symbol<deci::parser_t::by_state>).
                                      super_by_state.state * 2);
  bVar1 = yy_pact_value_is_default_(yyvalue);
  if (!bVar1) {
    if (yyvalue < 0) {
      local_40 = -yyvalue;
    }
    else {
      local_40 = S_YYEOF;
    }
    local_44 = 0x131 - yyvalue;
    if (S_43_statement_list_ < local_44) {
      local_44 = S_YYACCEPT;
    }
    for (local_3c = local_40; local_3c < local_44; local_3c = local_3c + S_YYerror) {
      if ((((char)yycheck_[local_3c + yyvalue] == local_3c) && (local_3c != S_YYerror)) &&
         (bVar1 = yy_table_value_is_error_((int)(char)yytable_[local_3c + yyvalue]), !bVar1)) {
        if (yyarg != (symbol_kind_type *)0x0) {
          if (yyxbegin == yyargn) {
            return 0;
          }
          yyarg[yyxbegin] = local_3c;
        }
        yyxbegin = yyxbegin + 1;
      }
    }
  }
  if (((yyarg != (symbol_kind_type *)0x0) && (yyxbegin == 0)) && (0 < yyargn)) {
    *yyarg = S_YYEMPTY;
  }
  return yyxbegin;
}

Assistant:

int
   parser_t ::context::expected_tokens (symbol_kind_type yyarg[], int yyargn) const
  {
    // Actual number of expected tokens
    int yycount = 0;

    const int yyn = yypact_[+yyparser_.yystack_[0].state];
    if (!yy_pact_value_is_default_ (yyn))
      {
        /* Start YYX at -YYN if negative to avoid negative indexes in
           YYCHECK.  In other words, skip the first -YYN actions for
           this state because they are default actions.  */
        const int yyxbegin = yyn < 0 ? -yyn : 0;
        // Stay within bounds of both yycheck and yytname.
        const int yychecklim = yylast_ - yyn + 1;
        const int yyxend = yychecklim < YYNTOKENS ? yychecklim : YYNTOKENS;
        for (int yyx = yyxbegin; yyx < yyxend; ++yyx)
          if (yycheck_[yyx + yyn] == yyx && yyx != symbol_kind::S_YYerror
              && !yy_table_value_is_error_ (yytable_[yyx + yyn]))
            {
              if (!yyarg)
                ++yycount;
              else if (yycount == yyargn)
                return 0;
              else
                yyarg[yycount++] = YY_CAST (symbol_kind_type, yyx);
            }
      }

    if (yyarg && yycount == 0 && 0 < yyargn)
      yyarg[0] = symbol_kind::S_YYEMPTY;
    return yycount;
  }